

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QXmlStreamAttribute>::end(QList<QXmlStreamAttribute> *this)

{
  QXmlStreamAttribute *n;
  QArrayDataPointer<QXmlStreamAttribute> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QXmlStreamAttribute> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QXmlStreamAttribute> *)0x6625d9);
  QArrayDataPointer<QXmlStreamAttribute>::operator->(in_RDI);
  n = QArrayDataPointer<QXmlStreamAttribute>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }